

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

bool __thiscall QAccessibleAbstractScrollArea::isValid(QAccessibleAbstractScrollArea *this)

{
  bool bVar1;
  QAbstractScrollArea *pQVar2;
  QWidget *pQVar3;
  QAccessibleWidget *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar4;
  
  bVar1 = QAccessibleWidget::isValid(in_RDI);
  uVar4 = false;
  if (bVar1) {
    pQVar2 = abstractScrollArea((QAccessibleAbstractScrollArea *)0x7d5bc3);
    uVar4 = false;
    if (pQVar2 != (QAbstractScrollArea *)0x0) {
      abstractScrollArea((QAccessibleAbstractScrollArea *)0x7d5bdb);
      pQVar3 = QAbstractScrollArea::viewport
                         ((QAbstractScrollArea *)CONCAT17(uVar4,in_stack_fffffffffffffff0));
      uVar4 = pQVar3 != (QWidget *)0x0;
    }
  }
  return (bool)uVar4;
}

Assistant:

bool QAccessibleAbstractScrollArea::isValid() const
{
    return (QAccessibleWidget::isValid() && abstractScrollArea() && abstractScrollArea()->viewport());
}